

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38d868::ExchangeSectionFixups::ExchangeSectionFixups(ExchangeSectionFixups *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ExchangeSectionFixups_0022d1e0;
  in_memory_store::in_memory_store(&this->db_storage_);
  pstore::database::database<pstore::file::in_memory>(&this->db_,&(this->db_storage_).file_,true);
  (this->db_).vacuum_mode_ = disabled;
  return;
}

Assistant:

ExchangeSectionFixups ()
                : db_storage_{}
                , db_{db_storage_.file ()} {
            db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }